

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

uint __thiscall
Js::ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
          (Data *this,OpCodeAsmJs op,void *rawData,int byteSize,ByteCodeWriter *writer,
          bool isPatching)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint offset;
  bool isPatching_local;
  ByteCodeWriter *writer_local;
  int byteSize_local;
  void *rawData_local;
  OpCodeAsmJs op_local;
  Data *this_local;
  
  if ((rawData == (void *)0x0) || (99 < byteSize)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x28,"((rawData != nullptr) && (byteSize < 100))",
                                "Ensure valid data for opcode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = EncodeT<(Js::LayoutSize)0>(this,op,writer,isPatching);
  Write(this,rawData,byteSize);
  return uVar3;
}

Assistant:

inline uint ByteCodeWriter::Data::EncodeT(OpCodeAsmJs op, const void* rawData, int byteSize, ByteCodeWriter* writer, bool isPatching)
    {
        AssertMsg((rawData != nullptr) && (byteSize < 100), "Ensure valid data for opcode");

        uint offset = EncodeT<layoutSize>(op, writer, isPatching);
        Write(rawData, byteSize);
        return offset;
    }